

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTriangleMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  uint v0;
  uint v1;
  bool bVar1;
  TriangleMeshNode *pTVar2;
  size_t sVar3;
  size_type siglen;
  reference pvVar4;
  undefined8 *in_RDX;
  uchar *sig;
  Triangle *in_RSI;
  XMLLoader *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  size_t i_13;
  vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> triangles;
  size_t i_10;
  avector<Vec3fa> vec;
  Ref<embree::XML> normalbuf;
  size_t i_7;
  Ref<embree::XML> animation_1;
  size_t i;
  Ref<embree::XML> animation;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh;
  Ref<embree::SceneGraph::MaterialNode> material;
  size_t i_11;
  size_t i_12;
  size_t i_9;
  size_t i_8;
  size_t i_5;
  size_t i_4;
  size_t i_6;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  value_type *in_stack_fffffffffffff628;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *in_stack_fffffffffffff630;
  string *in_stack_fffffffffffff638;
  XML *in_stack_fffffffffffff640;
  string *in_stack_fffffffffffff660;
  XML *in_stack_fffffffffffff668;
  size_t in_stack_fffffffffffff6b8;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffff6c0;
  TriangleMeshNode *in_stack_fffffffffffff6c8;
  allocator *paVar5;
  BBox1f in_stack_fffffffffffff6d0;
  string *in_stack_fffffffffffff6e8;
  XML *in_stack_fffffffffffff6f0;
  undefined1 *puVar6;
  size_t in_stack_fffffffffffff710;
  ulong uVar7;
  XML *in_stack_fffffffffffff718;
  Ref<embree::XML> *in_stack_fffffffffffff750;
  XMLLoader *in_stack_fffffffffffff758;
  Ref<embree::XML> *in_stack_fffffffffffff770;
  Ref<embree::XML> in_stack_fffffffffffff778;
  Ref<embree::XML> *in_stack_fffffffffffff840;
  Ref<embree::XML> in_stack_fffffffffffff848;
  XMLLoader *this_00;
  Triangle local_6e4;
  ulong local_6d8;
  allocator local_6c9;
  string local_6c8 [32];
  long *local_6a8;
  vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> local_6a0;
  allocator local_681;
  string local_680 [32];
  long *local_660 [4];
  ulong local_640;
  undefined1 local_638 [8];
  ulong local_630;
  allocator local_611;
  string local_610 [32];
  long *local_5f0;
  long *local_5e8;
  undefined1 local_5e0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_5d8;
  FILE *local_5c8;
  ulong local_5c0;
  allocator local_5b1;
  string local_5b0 [32];
  Ref<embree::XML> *local_590;
  allocator local_581;
  string local_580 [32];
  long *local_560;
  undefined1 local_558 [8];
  ulong local_550;
  _Base_ptr local_548;
  _Base_ptr local_540;
  allocator local_531;
  string local_530 [39];
  allocator local_509;
  string local_508 [32];
  long *local_4e8;
  undefined1 local_4e0 [8];
  ulong local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  long *local_4c0;
  undefined1 local_4b8 [8];
  ulong local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  ulong local_498;
  allocator local_489;
  string local_488 [32];
  long *local_468;
  undefined1 local_459;
  undefined4 local_458;
  undefined4 local_454;
  undefined4 local_450;
  undefined4 uStack_44c;
  long *local_448;
  Ref<embree::XML> local_440 [3];
  allocator local_421;
  string local_420 [32];
  long *local_400;
  long *local_3f8;
  undefined8 *local_3f0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  undefined8 *local_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  long **local_390;
  Ref<embree::XML> **local_388;
  long **local_380;
  undefined1 *local_378;
  undefined1 *local_368;
  undefined1 *local_358;
  undefined1 *local_348;
  undefined1 *local_338;
  undefined1 *local_328;
  long **local_320;
  long **local_310;
  long **local_300;
  long **local_2f0;
  long **local_2e0;
  XMLLoader *local_2d0;
  long **local_2c0;
  Ref<embree::XML> **local_2b0;
  long **local_2a0;
  long **local_290;
  undefined4 *local_280;
  undefined4 *local_278;
  undefined4 *local_270;
  Ref<embree::XML> **local_268;
  Ref<embree::XML> **local_260;
  long **local_258;
  long **local_250;
  long **local_248;
  long **local_240;
  long **local_238;
  long **local_228;
  TriangleMeshNode *local_218;
  Ref<embree::XML> *local_210;
  Ref<embree::XML> *local_208;
  Ref<embree::XML> *local_200;
  Ref<embree::XML> *local_1f8;
  Ref<embree::XML> *local_1f0;
  Ref<embree::XML> *local_1e8;
  Ref<embree::XML> *local_1e0;
  Ref<embree::XML> *local_1d8;
  Ref<embree::XML> *local_1d0;
  Ref<embree::XML> *local_1c8;
  Ref<embree::XML> *local_1c0;
  TriangleMeshNode *local_1b0;
  Ref<embree::XML> *local_1a0;
  ulong local_180;
  undefined1 *local_178;
  ulong local_160;
  undefined1 *local_158;
  ulong local_140;
  undefined1 *local_138;
  ulong local_120;
  undefined1 *local_118;
  ulong local_100;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 *local_e0;
  undefined1 *local_b0;
  undefined1 *local_80;
  undefined8 local_60;
  FILE *local_58;
  undefined1 *local_50;
  undefined1 *local_20;
  
  this_00 = in_RDI;
  local_3f0 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"material",&local_421);
  XML::child(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  loadMaterial(this_00,(Ref<embree::XML> *)in_RDI);
  local_320 = &local_400;
  if (local_400 != (long *)0x0) {
    (**(code **)(*local_400 + 0x18))();
  }
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  pTVar2 = (TriangleMeshNode *)::operator_new(0xd8);
  local_459 = 1;
  local_240 = &local_448;
  local_248 = &local_3f8;
  local_448 = local_3f8;
  if (local_3f8 != (long *)0x0) {
    (**(code **)(*local_3f8 + 0x10))();
  }
  local_454 = 0;
  local_458 = 0x3f800000;
  local_270 = &local_450;
  local_278 = &local_454;
  local_280 = &local_458;
  local_450 = 0;
  uStack_44c = 0x3f800000;
  SceneGraph::TriangleMeshNode::TriangleMeshNode
            (in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0,in_stack_fffffffffffff6d0,
             in_stack_fffffffffffff6b8);
  local_459 = 0;
  local_210 = local_440;
  local_218 = pTVar2;
  local_440[0].ptr = (XML *)pTVar2;
  if (pTVar2 != (TriangleMeshNode *)0x0) {
    (**(code **)(*(long *)&(pTVar2->super_Node).super_RefCount + 0x10))();
  }
  local_238 = &local_448;
  if (local_448 != (long *)0x0) {
    (**(code **)(*local_448 + 0x18))();
  }
  local_3a0 = local_3f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"animated_positions",&local_489);
  XML::childOpt(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  local_380 = &local_468;
  if (local_468 == (long *)0x0) {
    local_1d0 = local_440;
    local_3a8 = local_3f0;
    in_stack_fffffffffffff840 = (Ref<embree::XML> *)*local_3f0;
    in_stack_fffffffffffff848.ptr = local_440[0].ptr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_508,"positions",&local_509);
    XML::childOpt(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
    loadVec3faArray((XMLLoader *)in_stack_fffffffffffff848.ptr,in_stack_fffffffffffff840);
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 *)in_stack_fffffffffffff630,in_stack_fffffffffffff628);
    local_368 = local_4e0;
    for (local_120 = 0; local_120 < local_4d8; local_120 = local_120 + 1) {
    }
    local_118 = local_368;
    local_b0 = local_368;
    alignedFree(in_stack_fffffffffffff628);
    local_4c8 = 0;
    local_4d0 = 0;
    local_4d8 = 0;
    local_300 = &local_4e8;
    if (local_4e8 != (long *)0x0) {
      (**(code **)(*local_4e8 + 0x18))();
    }
    std::__cxx11::string::~string(local_508);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
    local_3b0 = local_3f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_530,"positions2",&local_531);
    bVar1 = XML::hasChild(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
    std::__cxx11::string::~string(local_530);
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
    if (bVar1) {
      local_1d8 = local_440;
      local_3b8 = local_3f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_580,"positions2",&local_581);
      XML::childOpt(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
      loadVec3faArray((XMLLoader *)in_stack_fffffffffffff848.ptr,in_stack_fffffffffffff840);
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   *)in_stack_fffffffffffff630,in_stack_fffffffffffff628);
      local_358 = local_558;
      for (local_140 = 0; local_140 < local_550; local_140 = local_140 + 1) {
      }
      local_138 = local_358;
      local_80 = local_358;
      alignedFree(in_stack_fffffffffffff628);
      local_540 = (_Base_ptr)0x0;
      local_548 = (_Base_ptr)0x0;
      local_550 = 0;
      local_2f0 = &local_560;
      if (local_560 != (long *)0x0) {
        (**(code **)(*local_560 + 0x18))();
      }
      std::__cxx11::string::~string(local_580);
      std::allocator<char>::~allocator((allocator<char> *)&local_581);
    }
  }
  else {
    local_498 = 0;
    while( true ) {
      uVar7 = local_498;
      local_250 = &local_468;
      sVar3 = XML::size((XML *)0x3de7f4);
      if (sVar3 <= uVar7) break;
      local_1c8 = local_440;
      local_258 = &local_468;
      XML::child(in_stack_fffffffffffff718,in_stack_fffffffffffff710);
      loadVec3faArray((XMLLoader *)in_stack_fffffffffffff848.ptr,in_stack_fffffffffffff840);
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   *)in_stack_fffffffffffff630,in_stack_fffffffffffff628);
      local_378 = local_4b8;
      for (local_100 = 0; local_100 < local_4b0; local_100 = local_100 + 1) {
      }
      local_f0 = local_4a8;
      local_e8 = local_4a0;
      local_f8 = local_378;
      local_e0 = local_378;
      alignedFree(in_stack_fffffffffffff628);
      local_4a0 = 0;
      local_4a8 = 0;
      local_4b0 = 0;
      local_310 = &local_4c0;
      if (local_4c0 != (long *)0x0) {
        (**(code **)(*local_4c0 + 0x18))();
      }
      local_498 = local_498 + 1;
    }
  }
  local_2e0 = &local_468;
  if (local_468 != (long *)0x0) {
    (**(code **)(*local_468 + 0x18))();
  }
  local_3c0 = local_3f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b0,"animated_normals",&local_5b1);
  XML::childOpt(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  local_388 = &local_590;
  if (local_590 == (Ref<embree::XML> *)0x0) {
    local_3c8 = local_3f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_610,"normals",&local_611);
    XML::childOpt(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
    std::__cxx11::string::~string(local_610);
    std::allocator<char>::~allocator((allocator<char> *)&local_611);
    local_390 = &local_5f0;
    if (local_5f0 != (long *)0x0) {
      loadVec3faArray((XMLLoader *)in_stack_fffffffffffff848.ptr,in_stack_fffffffffffff840);
      local_328 = local_638;
      if (local_630 != 0) {
        local_640 = 0;
        while( true ) {
          local_1e8 = local_440;
          uVar7 = local_640;
          sVar3 = SceneGraph::TriangleMeshNode::numTimeSteps((TriangleMeshNode *)0x3dfbd0);
          if (sVar3 <= uVar7) break;
          local_1f0 = local_440;
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                       *)in_stack_fffffffffffff640,(value_type *)in_stack_fffffffffffff638);
          local_640 = local_640 + 1;
        }
      }
      puVar6 = local_638;
      for (local_180 = 0; local_180 < local_630; local_180 = local_180 + 1) {
      }
      local_338 = puVar6;
      local_178 = puVar6;
      local_20 = puVar6;
      alignedFree(in_stack_fffffffffffff628);
      *(undefined8 *)(puVar6 + 0x18) = 0;
      *(undefined8 *)(puVar6 + 0x10) = 0;
      *(undefined8 *)(puVar6 + 8) = 0;
    }
    local_2c0 = &local_5f0;
    if (local_5f0 != (long *)0x0) {
      (**(code **)(*local_5f0 + 0x18))();
    }
  }
  else {
    local_5c0 = 0;
    while( true ) {
      uVar7 = local_5c0;
      local_260 = &local_590;
      sVar3 = XML::size((XML *)0x3df673);
      if (sVar3 <= uVar7) break;
      local_1e0 = local_440;
      local_268 = &local_590;
      in_stack_fffffffffffff770 = local_590;
      in_stack_fffffffffffff778.ptr = local_440[0].ptr;
      XML::child(in_stack_fffffffffffff718,in_stack_fffffffffffff710);
      loadVec3faArray((XMLLoader *)in_stack_fffffffffffff848.ptr,in_stack_fffffffffffff840);
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   *)in_stack_fffffffffffff630,in_stack_fffffffffffff628);
      local_348 = local_5e0;
      for (local_160 = 0; local_160 < local_5d8._M_allocated_capacity; local_160 = local_160 + 1) {
      }
      local_60 = local_5d8._8_8_;
      local_58 = local_5c8;
      local_158 = local_348;
      local_50 = local_348;
      alignedFree(in_stack_fffffffffffff628);
      local_5c8 = (FILE *)0x0;
      local_5d8._8_8_ = 0;
      local_5d8._M_allocated_capacity = 0;
      in_stack_fffffffffffff758 = (XMLLoader *)&local_5e8;
      local_2d0 = in_stack_fffffffffffff758;
      if (local_5e8 != (long *)0x0) {
        (**(code **)(*local_5e8 + 0x18))();
      }
      local_5c0 = local_5c0 + 1;
    }
  }
  local_2b0 = &local_590;
  if (local_590 != (Ref<embree::XML> *)0x0) {
    (*(code *)(local_590->ptr->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)();
  }
  local_3d0 = local_3f0;
  paVar5 = &local_681;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_680,"texcoords",paVar5);
  XML::childOpt(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
  loadVec2fArray(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
  local_1f8 = local_440;
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::operator=
            ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
             in_stack_fffffffffffff640,
             (vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
             in_stack_fffffffffffff638);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::~vector
            ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
             in_stack_fffffffffffff640);
  local_2a0 = local_660;
  if (local_660[0] != (long *)0x0) {
    (**(code **)(*local_660[0] + 0x18))();
  }
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  local_3d8 = local_3f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c8,"triangles",&local_6c9);
  XML::childOpt(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
  loadVec3iArray((XMLLoader *)in_stack_fffffffffffff778.ptr,in_stack_fffffffffffff770);
  local_290 = &local_6a8;
  if (local_6a8 != (long *)0x0) {
    (**(code **)(*local_6a8 + 0x18))();
  }
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  for (local_6d8 = 0; uVar7 = local_6d8,
      siglen = std::vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>::size(&local_6a0)
      , uVar7 < siglen; local_6d8 = local_6d8 + 1) {
    local_200 = local_440;
    pvVar4 = std::vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>::operator[]
                       (&local_6a0,local_6d8);
    v0 = (pvVar4->field_0).field_0.x;
    pvVar4 = std::vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>::operator[]
                       (&local_6a0,local_6d8);
    v1 = (pvVar4->field_0).field_0.y;
    pvVar4 = std::vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>::operator[]
                       (&local_6a0,local_6d8);
    SceneGraph::TriangleMeshNode::Triangle::Triangle(&local_6e4,v0,v1,(pvVar4->field_0).field_0.z);
    in_RSI = &local_6e4;
    std::
    vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
    ::push_back(in_stack_fffffffffffff630,(value_type *)in_stack_fffffffffffff628);
  }
  local_208 = local_440;
  SceneGraph::TriangleMeshNode::verify
            ((TriangleMeshNode *)local_440[0].ptr,(EVP_PKEY_CTX *)in_RSI,sig,siglen,in_R8,in_R9);
  local_1c0 = local_440;
  local_1b0 = (TriangleMeshNode *)local_440[0].ptr;
  *(XML **)&(in_RDI->path).filename = local_440[0].ptr;
  if (*(XML **)&(in_RDI->path).filename != (XML *)0x0) {
    (*((*(XML **)&(in_RDI->path).filename)->super_RefCount)._vptr_RefCount[2])();
  }
  std::vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>::~vector
            ((vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> *)
             in_stack_fffffffffffff640);
  local_1a0 = local_440;
  if ((TriangleMeshNode *)local_440[0].ptr != (TriangleMeshNode *)0x0) {
    (*(((Node *)&(local_440[0].ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  local_228 = &local_3f8;
  if (local_3f8 != (long *)0x0) {
    (**(code **)(*local_3f8 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this_00;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTriangleMesh(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3faArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) 
        mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions2")));
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
    }
    else if (Ref<XML> normalbuf = xml->childOpt("normals")) {
      auto vec = loadVec3faArray(normalbuf);
      if (vec.size())
        for (size_t i=0; i<mesh->numTimeSteps(); i++)
          mesh->normals.push_back(vec);
    }
    
    mesh->texcoords = loadVec2fArray(xml->childOpt("texcoords"));

    std::vector<Vec3i> triangles = loadVec3iArray(xml->childOpt("triangles"));
    for (size_t i=0; i<triangles.size(); i++) 
      mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(triangles[i].x,triangles[i].y,triangles[i].z));

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }